

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_node_main.c
# Opt level: O1

apx_error_t start_json_message_server(void)

{
  int iVar1;
  apx_error_t aVar2;
  char *socket_path;
  uint uVar3;
  
  socket_path = (char *)adt_str_cstr(m_bind_address);
  uVar3 = (uint)m_bind_resource_type;
  if (1 < uVar3 - 1) {
    if (uVar3 == 3) {
      aVar2 = json_server_start_unix(socket_path);
      return aVar2;
    }
    if ((uVar3 != 4) ||
       ((*socket_path != '\0' && (iVar1 = strcmp(socket_path,"localhost"), iVar1 != 0)))) {
      return 1;
    }
    socket_path = "127.0.0.1";
  }
  aVar2 = json_server_start_tcp(socket_path,m_bind_port);
  return aVar2;
}

Assistant:

static apx_error_t start_json_message_server(void)
{
   const char *bind_address = adt_str_cstr(m_bind_address);
   switch(m_bind_resource_type)
   {
   case APX_RESOURCE_TYPE_UNKNOWN:
      return APX_INVALID_ARGUMENT_ERROR;
   case APX_RESOURCE_TYPE_IPV4: //fall-through
   case APX_RESOURCE_TYPE_IPV6:
      return json_server_start_tcp(bind_address, m_bind_port);
   case APX_RESOURCE_TYPE_FILE:
#ifdef _WIN32
      printf("UNIX domain sockets not supported in Windows\n");
      return APX_NOT_IMPLEMENTED_ERROR;
#else
      return json_server_start_unix(bind_address);
#endif
   case APX_RESOURCE_TYPE_NAME:
      if ( (strlen(bind_address) == 0) || (strcmp(bind_address, "localhost") == 0) )
      {
         return json_server_start_tcp("127.0.0.1", m_bind_port);
      }
   }
   return APX_INVALID_ARGUMENT_ERROR;
}